

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O2

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U32 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize
                       ,int bmi2)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  size_t pos;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  undefined4 uVar11;
  int iVar12;
  ushort uVar13;
  U16 *symbolNext;
  U32 s;
  ulong uVar14;
  ulong uVar15;
  U64 sv;
  long lVar16;
  U32 s_1;
  uint uVar17;
  long lVar18;
  
  uVar11 = 1;
  bVar6 = (byte)tableLog;
  uVar2 = 1 << (bVar6 & 0x1f);
  uVar15 = (ulong)(maxSymbolValue + 1);
  uVar10 = uVar2 - 1;
  uVar8 = uVar10;
  for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
    sVar1 = normalizedCounter[uVar14];
    if (sVar1 == -1) {
      uVar4 = (ulong)uVar8;
      uVar8 = uVar8 - 1;
      dt[uVar4 + 1].baseValue = (U32)uVar14;
      sVar1 = 1;
    }
    else if ((0x10000 << (bVar6 - 1 & 0x1f)) >> 0x10 <= (int)sVar1) {
      uVar11 = 0;
    }
    *(short *)((long)wksp + uVar14 * 2) = sVar1;
  }
  dt->nextState = (short)uVar11;
  dt->nbAdditionalBits = (char)((uint)uVar11 >> 0x10);
  dt->nbBits = (char)((uint)uVar11 >> 0x18);
  dt->baseValue = tableLog;
  iVar12 = (uVar2 >> 3) + (uVar2 >> 1) + 3;
  if (uVar8 == uVar10) {
    lVar9 = (long)wksp + 0x6a;
    lVar16 = 0;
    lVar5 = 0;
    for (uVar14 = 0; uVar14 != uVar15; uVar14 = uVar14 + 1) {
      sVar1 = normalizedCounter[uVar14];
      *(long *)((long)wksp + lVar5 + 0x6a) = lVar16;
      for (lVar18 = 0x72; lVar18 + -0x6a < (long)sVar1; lVar18 = lVar18 + 8) {
        *(long *)((long)wksp + lVar18 + lVar5) = lVar16;
      }
      lVar5 = lVar5 + sVar1;
      lVar16 = lVar16 + 0x101010101010101;
    }
    uVar8 = 0;
    for (uVar15 = 0; uVar15 < uVar2; uVar15 = uVar15 + 2) {
      uVar3 = uVar8;
      for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
        dt[(ulong)(uVar3 & uVar10) + 1].baseValue = (uint)*(byte *)(lVar9 + lVar5);
        uVar3 = uVar3 + iVar12;
      }
      uVar8 = uVar8 + iVar12 * 2 & uVar10;
      lVar9 = lVar9 + 2;
    }
  }
  else {
    uVar4 = 0;
    for (uVar14 = 0; uVar14 != uVar15; uVar14 = uVar14 + 1) {
      uVar13 = normalizedCounter[uVar14];
      uVar3 = 0;
      if ((short)uVar13 < 1) {
        uVar13 = 0;
      }
      for (; uVar3 != uVar13; uVar3 = uVar3 + 1) {
        dt[uVar4 + 1].baseValue = (U32)uVar14;
        do {
          uVar17 = (int)uVar4 + iVar12 & uVar10;
          uVar4 = (ulong)uVar17;
        } while (uVar8 < uVar17);
      }
    }
  }
  for (uVar15 = 0; uVar2 != uVar15; uVar15 = uVar15 + 1) {
    uVar14 = (ulong)dt[uVar15 + 1].baseValue;
    uVar13 = *(ushort *)((long)wksp + uVar14 * 2);
    *(ushort *)((long)wksp + uVar14 * 2) = uVar13 + 1;
    iVar12 = 0x1f;
    if (uVar13 != 0) {
      for (; uVar13 >> iVar12 == 0; iVar12 = iVar12 + -1) {
      }
    }
    bVar7 = bVar6 - (char)iVar12;
    dt[uVar15 + 1].nbBits = bVar7;
    dt[uVar15 + 1].nextState = (uVar13 << (bVar7 & 0x1f)) - (short)uVar2;
    dt[uVar15 + 1].nbAdditionalBits = (BYTE)nbAdditionalBits[uVar14];
    dt[uVar15 + 1].baseValue = baseValue[uVar14];
  }
  return;
}

Assistant:

void ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U32* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        ZSTD_buildFSETable_body_bmi2(dt, normalizedCounter, maxSymbolValue,
                baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
        return;
    }
#endif
    (void)bmi2;
    ZSTD_buildFSETable_body_default(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}